

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unewdata.cpp
# Opt level: O0

void udata_createDummy(char *dir,char *type,char *name,UErrorCode *pErrorCode)

{
  FILE *__stream;
  UBool UVar1;
  UNewDataMemory *pData;
  char *pcVar2;
  UErrorCode *pErrorCode_local;
  char *name_local;
  char *type_local;
  char *dir_local;
  
  UVar1 = U_SUCCESS(*pErrorCode);
  if (UVar1 != '\0') {
    pData = udata_create(dir,type,name,&dummyDataInfo,(char *)0x0,pErrorCode);
    udata_finish(pData,pErrorCode);
    UVar1 = U_FAILURE(*pErrorCode);
    __stream = _stderr;
    if (UVar1 != '\0') {
      pcVar2 = u_errorName_63(*pErrorCode);
      fprintf(__stream,"error %s writing dummy data file %s/%s.%s\n",pcVar2,dir,name,type);
      exit(*pErrorCode);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_createDummy(const char *dir, const char *type, const char *name, UErrorCode *pErrorCode) {
    if(U_SUCCESS(*pErrorCode)) {
        udata_finish(udata_create(dir, type, name, &dummyDataInfo, NULL, pErrorCode), pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            fprintf(stderr, "error %s writing dummy data file %s" U_FILE_SEP_STRING "%s.%s\n",
                    u_errorName(*pErrorCode), dir, name, type);
            exit(*pErrorCode);
        }
    }
}